

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O0

int rops_alpn_negotiated_h1(lws *wsi,char *alpn)

{
  undefined8 in_R8;
  undefined8 in_R9;
  char *alpn_local;
  lws *wsi_local;
  
  _lws_log(0x10,"%s: client %d\n","rops_alpn_negotiated_h1",
           (ulong)((wsi->wsistate & 0x10000000) != 0),in_R8,in_R9,alpn);
  if ((wsi->wsistate & 0x10000000) != 0) {
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffbffffffffffff | 0x4000000000000
    ;
  }
  return 0;
}

Assistant:

static int
rops_alpn_negotiated_h1(struct lws *wsi, const char *alpn)
{
	lwsl_debug("%s: client %d\n", __func__, lwsi_role_client(wsi));
#if defined(LWS_WITH_CLIENT)
	if (lwsi_role_client(wsi)) {
		/*
		 * If alpn asserts it is http/1.1, server support for KA is
		 * mandatory.
		 *
		 * Knowing this lets us proceed with sending pipelined headers
		 * before we received the first response headers.
		 */
		wsi->keepalive_active = 1;
	}
#endif

	return 0;
}